

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O1

url_mapper * __thiscall cppcms::url_mapper::data::is_app(data *this,string_key *key)

{
  application *this_00;
  const_iterator cVar1;
  url_mapper *puVar2;
  
  cVar1 = std::
          _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>,_std::_Select1st<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
          ::find(&(this->by_key)._M_t,key);
  if ((((_Rb_tree_header *)cVar1._M_node != &(this->by_key)._M_t._M_impl.super__Rb_tree_header) &&
      (cVar1._M_node[3]._M_parent != (_Base_ptr)&cVar1._M_node[2]._M_right)) &&
     (this_00 = (application *)cVar1._M_node[3]._M_parent[3]._M_left, this_00 != (application *)0x0)
     ) {
    puVar2 = application::mapper(this_00);
    return puVar2;
  }
  return (url_mapper *)0x0;
}

Assistant:

url_mapper *is_app(string_key const &key) const
		{
			by_key_type::const_iterator kp = by_key.find(key);
			if(kp == by_key.end())
				return 0;
			by_size_type::const_iterator sp = kp->second.begin();
			if(sp==kp->second.end())
				return 0;
			if(sp->second.child) 
				return &sp->second.child->mapper();
			return 0;
		}